

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::to_string_abi_cxx11_(string *__return_storage_ptr__,tinyusdz *this,Basis *ty)

{
  int iVar1;
  Basis *ty_local;
  string *s;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  iVar1 = *(int *)this;
  if (iVar1 == 0) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"bezier");
  }
  else if (iVar1 == 1) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"bspline");
  }
  else if (iVar1 == 2) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"catmullRom");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const GeomBasisCurves::Basis &ty) {
  std::string s;

  switch (ty) {
    case GeomBasisCurves::Basis::Bezier: {
      s = "bezier";
      break;
    }
    case GeomBasisCurves::Basis::Bspline: {
      s = "bspline";
      break;
    }
    case GeomBasisCurves::Basis::CatmullRom: {
      s = "catmullRom";
      break;
    }
  }

  return s;
}